

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O3

void __thiscall
leveldb::CorruptionTest::Corrupt
          (CorruptionTest *this,FileType filetype,int offset,int bytes_to_corrupt)

{
  Env *pEVar1;
  pointer pcVar2;
  Status SVar3;
  CorruptionTest *pCVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  Tester *pTVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  Status s;
  string contents;
  FileType type;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  uint64_t number;
  uint64_t file_size;
  Status local_280;
  FileType local_274;
  string local_270;
  int local_250;
  FileType local_24c;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  CorruptionTest *local_210;
  int local_208 [2];
  string local_200;
  ulong local_1e0;
  ulong local_1d8;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  long alStack_1b8 [49];
  
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1c0._4_4_,0x73);
  local_274 = filetype;
  local_250 = offset;
  std::__cxx11::stringstream::stringstream((stringstream *)alStack_1b8);
  pEVar1 = (this->env_).super_EnvWrapper.target_;
  (*pEVar1->_vptr_Env[7])(&local_248,pEVar1,&this->dbname_,&local_228);
  test::Tester::IsOk((Tester *)local_1d0,(Status *)&local_248);
  local_210 = this;
  local_1e0 = (ulong)(uint)bytes_to_corrupt;
  if (local_248._M_dataplus._M_p != (pointer)0x0) {
    operator_delete__(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  if (local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar13 = -1;
    lVar12 = 0;
    uVar10 = 0;
    do {
      bVar5 = ParseFileName((string *)
                            ((long)&((local_228.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar12),(uint64_t *)local_208,&local_24c);
      if (((bVar5) && (local_24c == local_274)) && (iVar13 < local_208[0])) {
        pcVar2 = (local_210->dbname_)._M_dataplus._M_p;
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,pcVar2,pcVar2 + (local_210->dbname_)._M_string_length);
        std::__cxx11::string::append((char *)&local_270);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_270,
                                    *(ulong *)((long)&((local_228.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12));
        ppaVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)*plVar7 == ppaVar9) {
          local_1c0 = *ppaVar9;
          alStack_1b8[0] = plVar7[3];
          local_1d0._0_8_ = &local_1c0;
        }
        else {
          local_1c0 = *ppaVar9;
          local_1d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)*plVar7;
        }
        local_1d0._8_8_ = plVar7[1];
        *plVar7 = (long)ppaVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_248,(string *)local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)local_1d0._0_8_ != &local_1c0) {
          operator_delete((void *)local_1d0._0_8_);
        }
        iVar13 = local_208[0];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p);
          iVar13 = local_208[0];
        }
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x20;
    } while (uVar10 < (ulong)((long)local_228.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_228.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c0._0_4_ = 0x7f;
  std::__cxx11::stringstream::stringstream((stringstream *)alStack_1b8);
  pTVar8 = test::Tester::Is((Tester *)local_1d0,local_248._M_string_length != 0,"!fname.empty()");
  pCVar4 = local_210;
  test::Tester::operator<<(pTVar8,&local_274);
  test::Tester::~Tester((Tester *)local_1d0);
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1c0._4_4_,0x82);
  std::__cxx11::stringstream::stringstream((stringstream *)alStack_1b8);
  pEVar1 = (pCVar4->env_).super_EnvWrapper.target_;
  (*pEVar1->_vptr_Env[0xb])(&local_270,pEVar1,&local_248);
  test::Tester::IsOk((Tester *)local_1d0,(Status *)&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_270._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  iVar6 = (int)local_1d8;
  iVar13 = local_250;
  if ((local_250 < 0) && (iVar13 = 0, (uint)-local_250 <= local_1d8)) {
    iVar13 = local_250 + iVar6;
  }
  if (local_1d8 < (ulong)(long)iVar13) {
    iVar13 = iVar6;
  }
  uVar11 = iVar6 - iVar13;
  if ((ulong)(long)(int)(iVar13 + (uint)local_1e0) <= local_1d8) {
    uVar11 = (uint)local_1e0;
  }
  local_270._M_string_length = 0;
  local_270.field_2._M_local_buf[0] = '\0';
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  ReadFileToString((leveldb *)&local_280,(pCVar4->env_).super_EnvWrapper.target_,&local_248,
                   &local_270);
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1c0._4_4_,0x96);
  std::__cxx11::stringstream::stringstream((stringstream *)alStack_1b8);
  pTVar8 = test::Tester::Is((Tester *)local_1d0,local_280.state_ == (pointer)0x0,"s.ok()");
  Status::ToString_abi_cxx11_(&local_200,&local_280);
  test::Tester::operator<<(pTVar8,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  if (0 < (int)uVar11) {
    lVar12 = (long)iVar13;
    uVar10 = (ulong)uVar11;
    do {
      local_270._M_dataplus._M_p[lVar12] = local_270._M_dataplus._M_p[lVar12] ^ 0x80;
      lVar12 = lVar12 + 1;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  local_1d0._0_8_ = local_270._M_dataplus._M_p;
  local_1d0._8_8_ = local_270._M_string_length;
  WriteStringToFile((leveldb *)&local_200,(pCVar4->env_).super_EnvWrapper.target_,(Slice *)local_1d0
                    ,&local_248);
  SVar3.state_ = local_280.state_;
  local_280.state_ = local_200._M_dataplus._M_p;
  local_200._M_dataplus._M_p = SVar3.state_;
  if (SVar3.state_ != (pointer)0x0) {
    operator_delete__(SVar3.state_);
  }
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1c0._4_4_,0x9b);
  std::__cxx11::stringstream::stringstream((stringstream *)alStack_1b8);
  pTVar8 = test::Tester::Is((Tester *)local_1d0,local_280.state_ == (pointer)0x0,"s.ok()");
  Status::ToString_abi_cxx11_(&local_200,&local_280);
  test::Tester::operator<<(pTVar8,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  if (local_280.state_ != (pointer)0x0) {
    operator_delete__(local_280.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  return;
}

Assistant:

void Corrupt(FileType filetype, int offset, int bytes_to_corrupt) {
    // Pick file to corrupt
    std::vector<std::string> filenames;
    ASSERT_OK(env_.target()->GetChildren(dbname_, &filenames));
    uint64_t number;
    FileType type;
    std::string fname;
    int picked_number = -1;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) && type == filetype &&
          int(number) > picked_number) {  // Pick latest file
        fname = dbname_ + "/" + filenames[i];
        picked_number = number;
      }
    }
    ASSERT_TRUE(!fname.empty()) << filetype;

    uint64_t file_size;
    ASSERT_OK(env_.target()->GetFileSize(fname, &file_size));

    if (offset < 0) {
      // Relative to end of file; make it absolute
      if (-offset > file_size) {
        offset = 0;
      } else {
        offset = file_size + offset;
      }
    }
    if (offset > file_size) {
      offset = file_size;
    }
    if (offset + bytes_to_corrupt > file_size) {
      bytes_to_corrupt = file_size - offset;
    }

    // Do it
    std::string contents;
    Status s = ReadFileToString(env_.target(), fname, &contents);
    ASSERT_TRUE(s.ok()) << s.ToString();
    for (int i = 0; i < bytes_to_corrupt; i++) {
      contents[i + offset] ^= 0x80;
    }
    s = WriteStringToFile(env_.target(), contents, fname);
    ASSERT_TRUE(s.ok()) << s.ToString();
  }